

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnicodeString.cpp
# Opt level: O0

EStatusCode __thiscall
UnicodeString::FromUTF16LE(UnicodeString *this,uchar *inString,unsigned_long inLength)

{
  Trace *pTVar1;
  ulong local_50;
  value_type_conflict local_48;
  ushort local_40;
  ushort local_3e;
  ushort local_3c;
  ushort local_3a;
  unsigned_short lowSurrogate;
  unsigned_short buffer_1;
  unsigned_short highSurrogate;
  unsigned_short buffer;
  unsigned_long i;
  unsigned_long uStack_28;
  EStatusCode status;
  unsigned_long inLength_local;
  uchar *inString_local;
  UnicodeString *this_local;
  
  uStack_28 = inLength;
  inLength_local = (unsigned_long)inString;
  inString_local = (uchar *)this;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::clear
            (&this->mUnicodeCharacters);
  i._4_4_ = eSuccess;
  if ((uStack_28 & 1) == 0) {
    for (_lowSurrogate = 0; _lowSurrogate < uStack_28 - 1 && i._4_4_ == eSuccess;
        _lowSurrogate = _lowSurrogate + 2) {
      local_3a = (ushort)*(byte *)(inLength_local + 1 + _lowSurrogate) * 0x100 +
                 (ushort)*(byte *)(inLength_local + _lowSurrogate);
      if ((local_3a < 0xd800) || (0xdbff < local_3a)) {
        local_50 = (ulong)local_3a;
        std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&this->mUnicodeCharacters,&local_50);
      }
      else {
        _lowSurrogate = _lowSurrogate + 2;
        local_3c = local_3a;
        if (uStack_28 - 1 <= _lowSurrogate) {
          pTVar1 = Trace::DefaultTrace();
          Trace::TraceToLog(pTVar1,
                            "UnicodeString::FromUTF16LE, fault string - high surrogat encountered without a low surrogate"
                           );
          i._4_4_ = eFailure;
          break;
        }
        local_3e = (ushort)*(byte *)(inLength_local + 1 + _lowSurrogate) * 0x100 +
                   (ushort)*(byte *)(inLength_local + _lowSurrogate);
        if ((local_3e < 0xdc00) || (0xdfff < local_3e)) {
          pTVar1 = Trace::DefaultTrace();
          Trace::TraceToLog(pTVar1,
                            "UnicodeString::FromUTF16LE, fault string - high surrogat encountered without a low surrogate"
                           );
          i._4_4_ = eFailure;
          break;
        }
        local_48 = (value_type_conflict)(int)((local_3a - 0xd800) * 0x400 + local_3e + 0x2400);
        local_40 = local_3e;
        std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&this->mUnicodeCharacters,&local_48);
      }
    }
    this_local._4_4_ = i._4_4_;
  }
  else {
    pTVar1 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar1,
                      "UnicodeString::FromUTF16LE, invalid UTF16 string, has odd numbers of characters"
                     );
    this_local._4_4_ = eFailure;
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode UnicodeString::FromUTF16LE(const unsigned char* inString, unsigned long inLength)
{
	mUnicodeCharacters.clear();
	EStatusCode status = PDFHummus::eSuccess;

	if(inLength % 2 != 0)
	{
		TRACE_LOG("UnicodeString::FromUTF16LE, invalid UTF16 string, has odd numbers of characters");
		return PDFHummus::eFailure;
	}

	for(unsigned long i = 0; i < inLength-1 && PDFHummus::eSuccess == status; i+=2)
	{
		unsigned short buffer = (((unsigned short)inString[i+1])<<8) + inString[i];

		if(0xD800 <= buffer && buffer <= 0xDBFF) 
		{
			// Aha! high surrogate! this means that this character requires 2 w_chars
			unsigned short highSurrogate = buffer;
			i+=2;
			if(i>=inLength-1)
			{
				TRACE_LOG("UnicodeString::FromUTF16LE, fault string - high surrogat encountered without a low surrogate");
				status = PDFHummus::eFailure;
				break;
			}

			unsigned short buffer = (((unsigned short)inString[i+1])<<8) + inString[i];
			if(0xDC00 > buffer|| buffer > 0xDFFF)
			{
				TRACE_LOG("UnicodeString::FromUTF16LE, fault string - high surrogat encountered without a low surrogate");
				status = PDFHummus::eFailure;
				break;
			}

			unsigned short lowSurrogate = buffer;

			mUnicodeCharacters.push_back(0x10000 + ((highSurrogate - 0xD800) << 10) + (lowSurrogate - 0xDC00));
		}
		else
			mUnicodeCharacters.push_back(buffer);		
	}

	return status;
}